

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lm_trie.c
# Opt level: O1

lm_trie_t * lm_trie_read_bin(uint32 *counts,int order,FILE *fp)

{
  lm_trie_t *trie;
  lm_trie_quant_t *plVar1;
  long lVar2;
  size_t sVar3;
  char *fmt;
  
  trie = lm_trie_init(*counts);
  if (order < 2) {
    trie->quant = (lm_trie_quant_t *)0x0;
    lVar2 = ftell((FILE *)fp);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
            ,0x194,"pos after quant: %ld\n",lVar2);
    fread(trie->unigrams,0xc,(ulong)(*counts + 1),(FILE *)fp);
    sVar3 = ftell((FILE *)fp);
    fmt = "pos after ug: %ld\n";
    lVar2 = 0x196;
  }
  else {
    plVar1 = lm_trie_quant_read_bin(fp,order);
    trie->quant = plVar1;
    lVar2 = ftell((FILE *)fp);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
            ,0x194,"pos after quant: %ld\n",lVar2);
    fread(trie->unigrams,0xc,(ulong)(*counts + 1),(FILE *)fp);
    lVar2 = ftell((FILE *)fp);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
            ,0x196,"pos after ug: %ld\n",lVar2);
    lm_trie_alloc_ngram(trie,counts,order);
    fread(trie->ngram_mem,1,trie->ngram_mem_size,(FILE *)fp);
    sVar3 = trie->ngram_mem_size;
    fmt = "#ngram_mem: %ld\n";
    lVar2 = 0x19a;
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
          ,lVar2,fmt,sVar3);
  return trie;
}

Assistant:

lm_trie_t *
lm_trie_read_bin(uint32 * counts, int order, FILE * fp)
{
    lm_trie_t *trie = lm_trie_init(counts[0]);
    trie->quant = (order > 1) ? lm_trie_quant_read_bin(fp, order) : NULL;
    E_INFO("pos after quant: %ld\n", ftell(fp));
    lm_trie_read_ug(trie, counts, fp);
    E_INFO("pos after ug: %ld\n", ftell(fp));
    if (order > 1) {
        lm_trie_alloc_ngram(trie, counts, order);
        fread(trie->ngram_mem, 1, trie->ngram_mem_size, fp);
        E_INFO("#ngram_mem: %ld\n", trie->ngram_mem_size);
    }
    return trie;
}